

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_bubble.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  int __tmp;
  int i;
  long lVar10;
  int arr [4534];
  undefined8 uStack_fc0;
  int local_fb8 [1002];
  
  iVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uStack_fc0 = 0x101204;
      iVar6 = rand();
      local_fb8[lVar10] = iVar6 % 100;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 1000);
    uVar7 = 0;
    bVar2 = true;
LAB_00101233:
    piVar5 = local_fb8 + uVar7;
    while( true ) {
      piVar8 = piVar5;
      iVar6 = (int)uVar7;
      if (0x3e6 < iVar6) break;
      iVar1 = *piVar8;
      uVar7 = (ulong)(iVar6 + 1);
      piVar5 = piVar8 + 1;
      if (local_fb8[uVar7] < iVar1) goto code_r0x00101255;
    }
    uVar7 = 0;
    bVar3 = !bVar2;
    bVar2 = 0x3e6 < iVar6;
    if (bVar3) goto LAB_00101233;
    lVar10 = 4;
    while (lVar10 != 4000) {
      piVar5 = (int *)((long)local_fb8 + lVar10);
      lVar4 = lVar10 + -4;
      lVar10 = lVar10 + 4;
      if (*piVar5 < *(int *)((long)local_fb8 + lVar4)) {
        uStack_fc0 = 0x1012da;
        __assert_fail("std::is_sorted(arr, arr + n)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_bubble.cpp"
                      ,0x42,"int main()");
      }
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 100) {
      uStack_fc0 = 0x1012ae;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully sorted using bubble sort! \n",0x28);
      return 0;
    }
  } while( true );
code_r0x00101255:
  *piVar8 = local_fb8[uVar7];
  local_fb8[uVar7] = iVar1;
  bVar2 = 0x3e6 < iVar6;
  goto LAB_00101233;
}

Assistant:

int main() {
    int n = 1000;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        bubble_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using bubble sort! \n";
    return 0;
}